

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.c
# Opt level: O0

void read_seq_parameter_set_rbsp(sps_t *sps,bs_t *b)

{
  uint32_t uVar1;
  int32_t iVar2;
  int iVar3;
  int local_1c;
  int i;
  bs_t *b_local;
  sps_t *sps_local;
  
  memset(sps,0,0x1028);
  sps->chroma_format_idc = 1;
  uVar1 = bs_read_u8(b);
  sps->profile_idc = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set0_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set1_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set2_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set3_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set4_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->constraint_set5_flag = uVar1;
  bs_skip_u(b,2);
  uVar1 = bs_read_u8(b);
  sps->level_idc = uVar1;
  uVar1 = bs_read_ue(b);
  sps->seq_parameter_set_id = uVar1;
  if (((((sps->profile_idc == 100) || (sps->profile_idc == 0x6e)) || (sps->profile_idc == 0x7a)) ||
      ((((sps->profile_idc == 0xf4 || (sps->profile_idc == 0x2c)) ||
        ((sps->profile_idc == 0x53 || ((sps->profile_idc == 0x56 || (sps->profile_idc == 0x76))))))
       || (sps->profile_idc == 0x80)))) ||
     (((sps->profile_idc == 0x8a || (sps->profile_idc == 0x8b)) || (sps->profile_idc == 0x86)))) {
    uVar1 = bs_read_ue(b);
    sps->chroma_format_idc = uVar1;
    if (sps->chroma_format_idc == 3) {
      uVar1 = bs_read_u1(b);
      sps->residual_colour_transform_flag = uVar1;
    }
    uVar1 = bs_read_ue(b);
    sps->bit_depth_luma_minus8 = uVar1;
    uVar1 = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = uVar1;
    uVar1 = bs_read_u1(b);
    sps->qpprime_y_zero_transform_bypass_flag = uVar1;
    uVar1 = bs_read_u1(b);
    sps->seq_scaling_matrix_present_flag = uVar1;
    if (sps->seq_scaling_matrix_present_flag != 0) {
      local_1c = 0;
      while( true ) {
        iVar3 = 0xc;
        if (sps->chroma_format_idc != 3) {
          iVar3 = 8;
        }
        if (iVar3 <= local_1c) break;
        uVar1 = bs_read_u1(b);
        sps->seq_scaling_list_present_flag[local_1c] = uVar1;
        if (sps->seq_scaling_list_present_flag[local_1c] != 0) {
          if (local_1c < 6) {
            read_scaling_list(b,sps->ScalingList4x4[local_1c],0x10,
                              sps->UseDefaultScalingMatrix4x4Flag + local_1c);
          }
          else {
            read_scaling_list(b,sps->ScalingList8x8[local_1c + -6],0x40,
                              sps->UseDefaultScalingMatrix8x8Flag + (local_1c + -6));
          }
        }
        local_1c = local_1c + 1;
      }
    }
  }
  uVar1 = bs_read_ue(b);
  sps->log2_max_frame_num_minus4 = uVar1;
  uVar1 = bs_read_ue(b);
  sps->pic_order_cnt_type = uVar1;
  if (sps->pic_order_cnt_type == 0) {
    uVar1 = bs_read_ue(b);
    sps->log2_max_pic_order_cnt_lsb_minus4 = uVar1;
  }
  else if (sps->pic_order_cnt_type == 1) {
    uVar1 = bs_read_u1(b);
    sps->delta_pic_order_always_zero_flag = uVar1;
    iVar2 = bs_read_se(b);
    sps->offset_for_non_ref_pic = iVar2;
    iVar2 = bs_read_se(b);
    sps->offset_for_top_to_bottom_field = iVar2;
    uVar1 = bs_read_ue(b);
    sps->num_ref_frames_in_pic_order_cnt_cycle = uVar1;
    for (local_1c = 0; local_1c < sps->num_ref_frames_in_pic_order_cnt_cycle;
        local_1c = local_1c + 1) {
      iVar2 = bs_read_se(b);
      sps->offset_for_ref_frame[local_1c] = iVar2;
    }
  }
  uVar1 = bs_read_ue(b);
  sps->num_ref_frames = uVar1;
  uVar1 = bs_read_u1(b);
  sps->gaps_in_frame_num_value_allowed_flag = uVar1;
  uVar1 = bs_read_ue(b);
  sps->pic_width_in_mbs_minus1 = uVar1;
  uVar1 = bs_read_ue(b);
  sps->pic_height_in_map_units_minus1 = uVar1;
  uVar1 = bs_read_u1(b);
  sps->frame_mbs_only_flag = uVar1;
  if (sps->frame_mbs_only_flag == 0) {
    uVar1 = bs_read_u1(b);
    sps->mb_adaptive_frame_field_flag = uVar1;
  }
  uVar1 = bs_read_u1(b);
  sps->direct_8x8_inference_flag = uVar1;
  uVar1 = bs_read_u1(b);
  sps->frame_cropping_flag = uVar1;
  if (sps->frame_cropping_flag != 0) {
    uVar1 = bs_read_ue(b);
    sps->frame_crop_left_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps->frame_crop_right_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps->frame_crop_top_offset = uVar1;
    uVar1 = bs_read_ue(b);
    sps->frame_crop_bottom_offset = uVar1;
  }
  uVar1 = bs_read_u1(b);
  sps->vui_parameters_present_flag = uVar1;
  if (sps->vui_parameters_present_flag != 0) {
    read_vui_parameters(sps,b);
  }
  return;
}

Assistant:

void read_seq_parameter_set_rbsp(sps_t* sps, bs_t* b)
{
    int i;

    if( 1 )
    {
        memset(sps, 0, sizeof(sps_t));
        sps->chroma_format_idc = 1; 
    }
 
    sps->profile_idc = bs_read_u8(b);
    sps->constraint_set0_flag = bs_read_u1(b);
    sps->constraint_set1_flag = bs_read_u1(b);
    sps->constraint_set2_flag = bs_read_u1(b);
    sps->constraint_set3_flag = bs_read_u1(b);
    sps->constraint_set4_flag = bs_read_u1(b);
    sps->constraint_set5_flag = bs_read_u1(b);
    /* reserved_zero_2bits */ bs_skip_u(b, 2);
    sps->level_idc = bs_read_u8(b);
    sps->seq_parameter_set_id = bs_read_ue(b);

    if( sps->profile_idc == 100 || sps->profile_idc == 110 ||
        sps->profile_idc == 122 || sps->profile_idc == 244 ||
        sps->profile_idc == 44 || sps->profile_idc == 83 ||
        sps->profile_idc == 86 || sps->profile_idc == 118 ||
        sps->profile_idc == 128 || sps->profile_idc == 138 ||
        sps->profile_idc == 139 || sps->profile_idc == 134
       )
    {
        sps->chroma_format_idc = bs_read_ue(b);
        if( sps->chroma_format_idc == 3 )
        {
            sps->residual_colour_transform_flag = bs_read_u1(b);
        }
        sps->bit_depth_luma_minus8 = bs_read_ue(b);
        sps->bit_depth_chroma_minus8 = bs_read_ue(b);
        sps->qpprime_y_zero_transform_bypass_flag = bs_read_u1(b);
        sps->seq_scaling_matrix_present_flag = bs_read_u1(b);
        if( sps->seq_scaling_matrix_present_flag )
        {
            for( i = 0; i < ((sps->chroma_format_idc != 3) ? 8 : 12); i++ )
            {
                sps->seq_scaling_list_present_flag[ i ] = bs_read_u1(b);
                if( sps->seq_scaling_list_present_flag[ i ] )
                {
                    if( i < 6 )
                    {
                        read_scaling_list( b, sps->ScalingList4x4[ i ], 16,
                                                 &( sps->UseDefaultScalingMatrix4x4Flag[ i ] ) );
                    }
                    else
                    {
                        read_scaling_list( b, sps->ScalingList8x8[ i - 6 ], 64,
                                                 &( sps->UseDefaultScalingMatrix8x8Flag[ i - 6 ] ) );
                    }
                }
            }
        }
    }
    sps->log2_max_frame_num_minus4 = bs_read_ue(b);
    sps->pic_order_cnt_type = bs_read_ue(b);
    if( sps->pic_order_cnt_type == 0 )
    {
        sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);
    }
    else if( sps->pic_order_cnt_type == 1 )
    {
        sps->delta_pic_order_always_zero_flag = bs_read_u1(b);
        sps->offset_for_non_ref_pic = bs_read_se(b);
        sps->offset_for_top_to_bottom_field = bs_read_se(b);
        sps->num_ref_frames_in_pic_order_cnt_cycle = bs_read_ue(b);
        for( i = 0; i < sps->num_ref_frames_in_pic_order_cnt_cycle; i++ )
        {
            sps->offset_for_ref_frame[ i ] = bs_read_se(b);
        }
    }
    sps->num_ref_frames = bs_read_ue(b);
    sps->gaps_in_frame_num_value_allowed_flag = bs_read_u1(b);
    sps->pic_width_in_mbs_minus1 = bs_read_ue(b);
    sps->pic_height_in_map_units_minus1 = bs_read_ue(b);
    sps->frame_mbs_only_flag = bs_read_u1(b);
    if( !sps->frame_mbs_only_flag )
    {
        sps->mb_adaptive_frame_field_flag = bs_read_u1(b);
    }
    sps->direct_8x8_inference_flag = bs_read_u1(b);
    sps->frame_cropping_flag = bs_read_u1(b);
    if( sps->frame_cropping_flag )
    {
        sps->frame_crop_left_offset = bs_read_ue(b);
        sps->frame_crop_right_offset = bs_read_ue(b);
        sps->frame_crop_top_offset = bs_read_ue(b);
        sps->frame_crop_bottom_offset = bs_read_ue(b);
    }
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if( sps->vui_parameters_present_flag )
    {
        read_vui_parameters(sps, b);
    }
}